

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

void __thiscall Table::closeTable(Table *this)

{
  pointer ppCVar1;
  Customer **i;
  pointer ppCVar2;
  
  ppCVar1 = (this->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar2 = (this->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppCVar2 != ppCVar1; ppCVar2 = ppCVar2 + 1
      ) {
    if (*ppCVar2 != (Customer *)0x0) {
      (*(*ppCVar2)->_vptr_Customer[1])();
    }
  }
  ppCVar2 = (this->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar2) {
    (this->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar2;
  }
  std::vector<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>::clear(&this->orderList)
  ;
  this->open = false;
  return;
}

Assistant:

void Table::closeTable() {
    for (auto &i : customersList) {
        delete i;
    }
    customersList.clear();
    orderList.clear();
    open=false;
}